

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O3

int * configuracaoInicial(char *arqIn)

{
  int iVar1;
  int *piVar2;
  int i;
  long lVar3;
  
  iVar1 = strcmp(arqIn,"networks/sis33.m");
  if ((iVar1 == 0) || (iVar1 = strcmp(arqIn,"networks/sis33modif.m"), iVar1 == 0)) {
    piVar2 = (int *)operator_new__(0x14);
    piVar2[0] = 0x21;
    piVar2[1] = 0x22;
    piVar2[2] = 0x23;
    piVar2[3] = 0x24;
    piVar2[4] = 0x25;
  }
  else {
    iVar1 = strcmp(arqIn,"networks/sis119.m");
    if (iVar1 == 0) {
      piVar2 = (int *)operator_new__(0x3c);
      piVar2[0] = 0x77;
      piVar2[1] = 0x78;
      piVar2[2] = 0x79;
      piVar2[3] = 0x7a;
      piVar2[4] = 0x7b;
      piVar2[5] = 0x7c;
      piVar2[6] = 0x7d;
      piVar2[7] = 0x7e;
      piVar2[8] = 0x7f;
      piVar2[9] = 0x80;
      piVar2[10] = 0x81;
      piVar2[0xb] = 0x82;
      piVar2[0xc] = 0x83;
      piVar2[0xd] = 0x84;
      piVar2[0xe] = 0x85;
      lVar3 = 0;
      do {
        piVar2[lVar3] = piVar2[lVar3] + -1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0xf);
    }
    else {
      iVar1 = strcmp(arqIn,"networks/sis83.m");
      if ((iVar1 == 0) || (iVar1 = strcmp(arqIn,"networks/sis83modif.m"), iVar1 == 0)) {
        piVar2 = (int *)operator_new__(0x34);
        piVar2[0] = 0x54;
        piVar2[1] = 0x55;
        piVar2[2] = 0x56;
        piVar2[3] = 0x57;
        piVar2[4] = 0x58;
        piVar2[5] = 0x59;
        piVar2[6] = 0x5a;
        piVar2[7] = 0x5b;
        piVar2[8] = 0x5c;
        piVar2[9] = 0x5d;
        piVar2[10] = 0x5e;
        piVar2[0xb] = 0x5f;
        piVar2[0xc] = 0x60;
      }
      else {
        piVar2 = (int *)operator_new__(4);
        *piVar2 = 0;
      }
    }
  }
  return piVar2;
}

Assistant:

int *configuracaoInicial(char *arqIn) {
    int *ids;
    if (strcmp(arqIn, "networks/sis33.m") == 0) {

        ids = new int[5];

        //CONFIGURACAO INICIAL
        if (strcmp(configuracao, "inicial") == 0) {
            ids[0] = 33;
            ids[1] = 34;
            ids[2] = 35;
            ids[3] = 36;
            ids[4] = 37;
        }
        //CONFIGURACAO DA LITERATURA
        if (strcmp(configuracao, "literatura1") == 0) {
            ids[0] = 7;
            ids[1] = 10;
            ids[2] = 14;
            ids[3] = 32;
            ids[4] = 37;
        }
        //ABORDAGEM ARSD
        if (strcmp(configuracao, "ARSD") == 0) {
            ids[0] = 7;
            ids[1] = 9;
            ids[2] = 14;
            ids[3] = 32;
            ids[4] = 37;
        }

        return ids;
    }

    if (strcmp(arqIn, "networks/sis33modif.m") == 0) {

        ids = new int[5];

        //CONFIGURACAO INICIAL
        if (strcmp(configuracao, "inicial") == 0) {
            ids[0] = 33;
            ids[1] = 34;
            ids[2] = 35;
            ids[3] = 36;
            ids[4] = 37;
        }
        //CONFIGURACAO DA LITERATURA
        if (strcmp(configuracao, "literatura1") == 0) {
            ids[0] = 7;
            ids[1] = 10;
            ids[2] = 14;
            ids[3] = 28;
            ids[4] = 36;
        }
        //ABORDAGEM ARSD
        if (strcmp(configuracao, "ARSD") == 0) {
            ids[0] = 7;
            ids[1] = 10;
            ids[2] = 14;
            ids[3] = 16;
            ids[4] = 28;
        }

        return ids;
    }

    if (strcmp(arqIn, "networks/sis119.m") == 0) {

        ids = new int[15];
        //CONFIGURACAO INICIAL
        if (strcmp(configuracao, "inicial") == 0) {
            ids[0] = 119;
            ids[1] = 120;
            ids[2] = 121;
            ids[3] = 122;
            ids[4] = 123;
            ids[5] = 124;
            ids[6] = 125;
            ids[7] = 126;
            ids[8] = 127;
            ids[9] = 128;
            ids[10] = 129;
            ids[11] = 130;
            ids[12] = 131;
            ids[13] = 132;
            ids[14] = 133;
        }
        //CONFIGURACAO DA LITERATURA
        if (strcmp(configuracao, "literatura1") == 0) {
            ids[0] = 24;
            ids[1] = 27;
            ids[2] = 35;
            ids[3] = 40;
            ids[4] = 43;
            ids[5] = 52;
            ids[6] = 59;
            ids[7] = 72;
            ids[8] = 75;
            ids[9] = 96;
            ids[10] = 99;
            ids[11] = 110;
            ids[12] = 123;
            ids[13] = 130;
            ids[14] = 131;
        }
        //ABORDAGEM ARSD
        if (strcmp(configuracao, "ARSD") == 0) {
            ids[0] = 24;
            ids[1] = 26;
            ids[2] = 35;
            ids[3] = 40;
            ids[4] = 43;
            ids[5] = 51;
            ids[6] = 61;
            ids[7] = 72;
            ids[8] = 75;
            ids[9] = 96;
            ids[10] = 98;
            ids[11] = 110;
            ids[12] = 122;
            ids[13] = 130;
            ids[14] = 131;
        }

        /*
        esse arquivo tem na verdade 132 arcos ao inves de 133
        dessa forma os ids dos arcos abertos deve ser subtraido 1.
        */
        for (int i = 0; i < 15; i++)
            ids[i]--;

        return ids;
    }
    if (strcmp(arqIn, "networks/sis83.m") == 0) {

        ids = new int[13];

        //CONFIGURACAO INICIAL
        if (strcmp(configuracao, "inicial") == 0) {
            ids[0] = 84;
            ids[1] = 85;
            ids[2] = 86;
            ids[3] = 87;
            ids[4] = 88;
            ids[5] = 89;
            ids[6] = 90;
            ids[7] = 91;
            ids[8] = 92;
            ids[9] = 93;
            ids[10] = 94;
            ids[11] = 95;
            ids[12] = 96;
        }
        //CONFIGURACAO DA LITERATURA
        if (strcmp(configuracao, "literatura1") == 0) {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 34;
            ids[3] = 39;
            ids[4] = 42;
            ids[5] = 55;
            ids[6] = 62;
            ids[7] = 72;
            ids[8] = 83;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }

        return ids;
    }
    if (strcmp(arqIn, "networks/sis83modif.m") == 0) {

        ids = new int[13];

        //CONFIGURACAO INICIAL
        if (strcmp(configuracao, "inicial") == 0) {
            ids[0] = 84;
            ids[1] = 85;
            ids[2] = 86;
            ids[3] = 87;
            ids[4] = 88;
            ids[5] = 89;
            ids[6] = 90;
            ids[7] = 91;
            ids[8] = 92;
            ids[9] = 93;
            ids[10] = 94;
            ids[11] = 95;
            ids[12] = 96;
        }
        //CONFIGURACAO DA LITERATURA
        if (strcmp(configuracao, "literatura1") == 0) {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 33;
            ids[3] = 38;
            ids[4] = 42;
            ids[5] = 63;
            ids[6] = 72;
            ids[7] = 83;
            ids[8] = 84;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }
        if (strcmp(configuracao, "literatura2") == 0) {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 34;
            ids[3] = 38;
            ids[4] = 42;
            ids[5] = 63;
            ids[6] = 72;
            ids[7] = 83;
            ids[8] = 84;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }
        if (strcmp(configuracao, "ARSD") == 0) {
            ids[0] = 7;
            ids[1] = 13;
            ids[2] = 34;
            ids[3] = 39;
            ids[4] = 42;
            ids[5] = 63;
            ids[6] = 72;
            ids[7] = 83;
            ids[8] = 84;
            ids[9] = 86;
            ids[10] = 89;
            ids[11] = 90;
            ids[12] = 92;
        }

        return ids;
    }

    ids = new int[1];
    ids[0] = 0;
    return ids;
}